

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::Texture2DFormatCase::init(Texture2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *str;
  ostringstream *this_00;
  TestLog *pTVar1;
  int iVar2;
  ostream *poVar3;
  MessageBuilder *pMVar4;
  Texture2D *this_01;
  Enum<int,_2UL> local_3a0 [2];
  TextureFormat fmt;
  LogGradientFmt local_378;
  TextureFormatInfo spec;
  ostringstream fmtName;
  MessageBuilder local_1b0;
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  fmt = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatInfo(&spec,&fmt);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
  local_1b0._8_4_ = this->m_format;
  local_1b0.m_log = (TestLog *)glu::getTextureFormatName;
  poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1b0,(ostream *)&fmtName);
  poVar3 = std::operator<<(poVar3,", ");
  local_3a0[0].m_value = this->m_dataType;
  local_3a0[0].m_getName = glu::getTypeName;
  tcu::Format::Enum<int,_2UL>::toStream(local_3a0,poVar3);
  this_00 = &local_1b0.m_str;
  local_1b0.m_log = pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"2D texture, ");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,(string *)local_3a0);
  std::operator<<((ostream *)this_00,", ");
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,&this->m_width);
  std::operator<<((ostream *)&pMVar4->m_str,"x");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_height);
  str = &pMVar4->m_str;
  std::operator<<((ostream *)str,",\n  fill with ");
  local_378.valueMin = &spec.valueMin;
  local_378.valueMax = &spec.valueMax;
  glu::TextureTestUtil::operator<<((ostream *)str,&local_378);
  std::operator<<((ostream *)str," gradient");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  this_01 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_01;
  tcu::Texture2D::allocLevel(&this_01->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&spec.valueMin,&spec.valueMax);
  iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
  return iVar2;
}

Assistant:

void Texture2DFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= glu::mapGLTransferFormat(m_format, m_dataType);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	fmtName << getTextureFormatStr(m_format) << ", " << getTypeStr(m_dataType);

	log << TestLog::Message << "2D texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);
}